

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlXPathObjectPtr xmlXPtrNewRangeNodes(xmlNodePtr start,xmlNodePtr end)

{
  xmlXPathObjectPtr ret;
  xmlNodePtr end_local;
  xmlNodePtr start_local;
  
  if (start == (xmlNodePtr)0x0) {
    start_local = (xmlNodePtr)0x0;
  }
  else if (end == (xmlNodePtr)0x0) {
    start_local = (xmlNodePtr)0x0;
  }
  else {
    start_local = (xmlNodePtr)xmlXPtrNewRangeInternal(start,-1,end,-1);
    xmlXPtrRangeCheckOrder((xmlXPathObjectPtr)start_local);
  }
  return (xmlXPathObjectPtr)start_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrNewRangeNodes(xmlNodePtr start, xmlNodePtr end) {
    xmlXPathObjectPtr ret;

    if (start == NULL)
	return(NULL);
    if (end == NULL)
	return(NULL);

    ret = xmlXPtrNewRangeInternal(start, -1, end, -1);
    xmlXPtrRangeCheckOrder(ret);
    return(ret);
}